

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,Layer *layer)

{
  bool in_R8B;
  string local_38;
  Layer *local_18;
  Layer *layer_local;
  ostream *ofs_local;
  
  local_18 = layer;
  layer_local = (Layer *)ofs;
  tinyusdz::to_string_abi_cxx11_(&local_38,(tinyusdz *)layer,(Layer *)0x0,1,in_R8B);
  std::operator<<(ofs,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)layer_local;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Layer &layer) {
  ofs << to_string(layer);
  return ofs;
}